

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize2.h
# Opt level: O0

void stbir__encode_uint8_srgb(void *outputp,int width_times_channels,float *encode)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  stbir_uint8 sVar23;
  uchar *puVar24;
  bool bVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined8 uStack_898;
  __m128i temp_3;
  __m128i temp_2;
  __m128i temp_1;
  __m128i temp;
  stbir__simdi_u32 temp3;
  stbir__simdi_u32 temp2;
  stbir__simdi_u32 temp1;
  stbir__simdi_u32 temp0;
  __m128 tmp3;
  __m128 tmp2;
  __m128 tmp1;
  __m128 tmp0;
  __m128i i3;
  __m128i i2;
  __m128i i1;
  __m128i i0;
  __m128 f3;
  __m128 f2;
  __m128 f1;
  __m128 f0;
  float *end_encode_m16;
  uchar *end_output;
  uchar *output;
  float *encode_local;
  int width_times_channels_local;
  void *outputp_local;
  short local_6e8;
  short sStack_6e6;
  short sStack_6e4;
  short sStack_6e2;
  short local_6d8;
  short sStack_6d6;
  short sStack_6d4;
  short sStack_6d2;
  short sStack_5a0;
  short sStack_59e;
  short sStack_59c;
  short sStack_59a;
  short sStack_590;
  short sStack_58e;
  short sStack_58c;
  short sStack_58a;
  undefined4 local_508;
  undefined4 uStack_504;
  undefined4 local_4f8;
  undefined4 uStack_4f4;
  undefined4 local_4e8;
  undefined4 uStack_4e4;
  undefined4 local_4d8;
  undefined4 uStack_4d4;
  undefined4 uStack_4c0;
  undefined4 uStack_4bc;
  undefined4 uStack_4b0;
  undefined4 uStack_4ac;
  undefined4 uStack_4a0;
  undefined4 uStack_49c;
  undefined4 uStack_490;
  undefined4 uStack_48c;
  uint local_2f8;
  uint uStack_2f4;
  uint uStack_2f0;
  uint uStack_2ec;
  uint local_2b8;
  uint uStack_2b4;
  uint uStack_2b0;
  uint uStack_2ac;
  uint local_278;
  uint uStack_274;
  uint uStack_270;
  uint uStack_26c;
  uint local_238;
  uint uStack_234;
  uint uStack_230;
  uint uStack_22c;
  uint local_1f8;
  uint uStack_1f4;
  uint uStack_1f0;
  uint uStack_1ec;
  uint local_1d8;
  uint uStack_1d4;
  uint uStack_1d0;
  uint uStack_1cc;
  uint local_1b8;
  uint uStack_1b4;
  uint uStack_1b0;
  uint uStack_1ac;
  uint local_198;
  uint uStack_194;
  uint uStack_190;
  uint uStack_18c;
  
  puVar24 = (uchar *)((long)outputp + (long)width_times_channels);
  if (width_times_channels < 0x10) {
    output = (uchar *)encode;
    for (end_output = (uchar *)((long)outputp + 4); end_output <= puVar24;
        end_output = end_output + 4) {
      sVar23 = stbir__linear_to_srgb_uchar(*(float *)output);
      end_output[-4] = sVar23;
      sVar23 = stbir__linear_to_srgb_uchar(*(float *)(output + 4));
      end_output[-3] = sVar23;
      sVar23 = stbir__linear_to_srgb_uchar(*(float *)(output + 8));
      end_output[-2] = sVar23;
      sVar23 = stbir__linear_to_srgb_uchar(*(float *)(output + 0xc));
      end_output[-1] = sVar23;
      output = output + 0x10;
    }
    for (end_output = end_output + -4; end_output < puVar24; end_output = end_output + 1) {
      sVar23 = stbir__linear_to_srgb_uchar(*(float *)output);
      *end_output = sVar23;
      output = output + 4;
    }
  }
  else {
    end_output = (uchar *)outputp;
    output = (uchar *)encode;
    do {
      do {
        local_4d8 = (undefined4)*(undefined8 *)output;
        uStack_4d4 = (undefined4)((ulong)*(undefined8 *)output >> 0x20);
        local_4e8 = (undefined4)*(undefined8 *)(output + 0x10);
        uStack_4e4 = (undefined4)((ulong)*(undefined8 *)(output + 0x10) >> 0x20);
        local_4f8 = (undefined4)*(undefined8 *)(output + 0x20);
        uStack_4f4 = (undefined4)((ulong)*(undefined8 *)(output + 0x20) >> 0x20);
        local_508 = (undefined4)*(undefined8 *)(output + 0x30);
        uStack_504 = (undefined4)((ulong)*(undefined8 *)(output + 0x30) >> 0x20);
        uStack_490 = (undefined4)*(undefined8 *)(output + 8);
        uStack_48c = (undefined4)((ulong)*(undefined8 *)(output + 8) >> 0x20);
        uStack_4a0 = (undefined4)*(undefined8 *)(output + 0x18);
        uStack_49c = (undefined4)((ulong)*(undefined8 *)(output + 0x18) >> 0x20);
        uStack_4b0 = (undefined4)*(undefined8 *)(output + 0x28);
        uStack_4ac = (undefined4)((ulong)*(undefined8 *)(output + 0x28) >> 0x20);
        uStack_4c0 = (undefined4)*(undefined8 *)(output + 0x38);
        uStack_4bc = (undefined4)((ulong)*(undefined8 *)(output + 0x38) >> 0x20);
        auVar6._4_4_ = local_4e8;
        auVar6._0_4_ = local_4d8;
        auVar6._12_4_ = local_508;
        auVar6._8_4_ = local_4f8;
        auVar4._12_4_ = uStack_504;
        auVar4._8_4_ = uStack_4f4;
        auVar4._4_4_ = uStack_4e4;
        auVar4._0_4_ = uStack_4d4;
        auVar2._4_4_ = uStack_4a0;
        auVar2._0_4_ = uStack_490;
        auVar2._12_4_ = uStack_4c0;
        auVar2._8_4_ = uStack_4b0;
        auVar27._12_4_ = uStack_4bc;
        auVar27._8_4_ = uStack_4ac;
        auVar27._4_4_ = uStack_49c;
        auVar27._0_4_ = uStack_48c;
        auVar5._8_8_ = 0x3900000039000000;
        auVar5._0_8_ = 0x3900000039000000;
        auVar26 = maxps(auVar6,auVar5);
        auVar10._8_8_ = 0x3f7fffff3f7fffff;
        auVar10._0_8_ = 0x3f7fffff3f7fffff;
        auVar26 = minps(auVar26,auVar10);
        local_198 = auVar26._0_4_;
        uStack_194 = auVar26._4_4_;
        uStack_190 = auVar26._8_4_;
        uStack_18c = auVar26._12_4_;
        auVar3._8_8_ = 0x3900000039000000;
        auVar3._0_8_ = 0x3900000039000000;
        auVar26 = maxps(auVar4,auVar3);
        auVar9._8_8_ = 0x3f7fffff3f7fffff;
        auVar9._0_8_ = 0x3f7fffff3f7fffff;
        auVar26 = minps(auVar26,auVar9);
        local_1b8 = auVar26._0_4_;
        uStack_1b4 = auVar26._4_4_;
        uStack_1b0 = auVar26._8_4_;
        uStack_1ac = auVar26._12_4_;
        auVar1._8_8_ = 0x3900000039000000;
        auVar1._0_8_ = 0x3900000039000000;
        auVar26 = maxps(auVar2,auVar1);
        auVar8._8_8_ = 0x3f7fffff3f7fffff;
        auVar8._0_8_ = 0x3f7fffff3f7fffff;
        auVar26 = minps(auVar26,auVar8);
        local_1d8 = auVar26._0_4_;
        uStack_1d4 = auVar26._4_4_;
        uStack_1d0 = auVar26._8_4_;
        uStack_1cc = auVar26._12_4_;
        auVar26._8_8_ = 0x3900000039000000;
        auVar26._0_8_ = 0x3900000039000000;
        auVar26 = maxps(auVar27,auVar26);
        auVar7._8_8_ = 0x3f7fffff3f7fffff;
        auVar7._0_8_ = 0x3f7fffff3f7fffff;
        auVar26 = minps(auVar26,auVar7);
        local_1f8 = auVar26._0_4_;
        uStack_1f4 = auVar26._4_4_;
        uStack_1f0 = auVar26._8_4_;
        uStack_1ec = auVar26._12_4_;
        temp1.m128i_u32[3] = (&DAT_009fdfb0)[(int)(uStack_194 >> 0x14)];
        temp1.m128i_u32[2] = (&DAT_009fdfb0)[(int)(local_198 >> 0x14)];
        temp0.m128i_u32[1] = (&DAT_009fdfb0)[(int)(uStack_18c >> 0x14)];
        temp0.m128i_u32[0] = (&DAT_009fdfb0)[(int)(uStack_190 >> 0x14)];
        temp2.m128i_u32[3] = (&DAT_009fdfb0)[(int)(uStack_1b4 >> 0x14)];
        temp2.m128i_u32[2] = (&DAT_009fdfb0)[(int)(local_1b8 >> 0x14)];
        temp1.m128i_u32[1] = (&DAT_009fdfb0)[(int)(uStack_1ac >> 0x14)];
        temp1.m128i_u32[0] = (&DAT_009fdfb0)[(int)(uStack_1b0 >> 0x14)];
        temp3.m128i_u32[3] = (&DAT_009fdfb0)[(int)(uStack_1d4 >> 0x14)];
        temp3.m128i_u32[2] = (&DAT_009fdfb0)[(int)(local_1d8 >> 0x14)];
        temp2.m128i_u32[1] = (&DAT_009fdfb0)[(int)(uStack_1cc >> 0x14)];
        temp2.m128i_u32[0] = (&DAT_009fdfb0)[(int)(uStack_1d0 >> 0x14)];
        temp[1] = CONCAT44((&DAT_009fdfb0)[(int)(uStack_1f4 >> 0x14)],
                           (&DAT_009fdfb0)[(int)(local_1f8 >> 0x14)]);
        temp3.m128i_u32[1] = (&DAT_009fdfb0)[(int)(uStack_1ec >> 0x14)];
        temp3.m128i_u32[0] = (&DAT_009fdfb0)[(int)(uStack_1f0 >> 0x14)];
        temp_1[1] = CONCAT44(uStack_194 >> 0xc,local_198 >> 0xc);
        temp[0] = CONCAT44(uStack_18c >> 0xc,uStack_190 >> 0xc);
        auVar18._8_8_ = temp0.m128i_i128[0];
        auVar18._0_8_ = temp1.m128i_i128[1];
        auVar17._8_8_ = temp[0] & 0xff000000ffU | 0x200000002000000;
        auVar17._0_8_ = temp_1[1] & 0xff000000ffU | 0x200000002000000;
        auVar26 = pmaddwd(auVar18,auVar17);
        local_238 = auVar26._0_4_;
        uStack_234 = auVar26._4_4_;
        uStack_230 = auVar26._8_4_;
        uStack_22c = auVar26._12_4_;
        i1[1] = CONCAT44(uStack_234 >> 0x10,local_238 >> 0x10);
        i0[0]._0_4_ = uStack_230 >> 0x10;
        i0[0]._4_4_ = uStack_22c >> 0x10;
        temp_2[1] = CONCAT44(uStack_1b4 >> 0xc,local_1b8 >> 0xc);
        temp_1[0] = CONCAT44(uStack_1ac >> 0xc,uStack_1b0 >> 0xc);
        auVar16._8_8_ = temp1.m128i_i128[0];
        auVar16._0_8_ = temp2.m128i_i128[1];
        auVar15._8_8_ = temp_1[0] & 0xff000000ffU | 0x200000002000000;
        auVar15._0_8_ = temp_2[1] & 0xff000000ffU | 0x200000002000000;
        auVar26 = pmaddwd(auVar16,auVar15);
        local_278 = auVar26._0_4_;
        uStack_274 = auVar26._4_4_;
        uStack_270 = auVar26._8_4_;
        uStack_26c = auVar26._12_4_;
        i2[1] = CONCAT44(uStack_274 >> 0x10,local_278 >> 0x10);
        i1[0]._0_4_ = uStack_270 >> 0x10;
        i1[0]._4_4_ = uStack_26c >> 0x10;
        temp_3[1] = CONCAT44(uStack_1d4 >> 0xc,local_1d8 >> 0xc);
        temp_2[0] = CONCAT44(uStack_1cc >> 0xc,uStack_1d0 >> 0xc);
        auVar14._8_8_ = temp2.m128i_i128[0];
        auVar14._0_8_ = temp3.m128i_i128[1];
        auVar13._8_8_ = temp_2[0] & 0xff000000ffU | 0x200000002000000;
        auVar13._0_8_ = temp_3[1] & 0xff000000ffU | 0x200000002000000;
        auVar26 = pmaddwd(auVar14,auVar13);
        local_2b8 = auVar26._0_4_;
        uStack_2b4 = auVar26._4_4_;
        uStack_2b0 = auVar26._8_4_;
        uStack_2ac = auVar26._12_4_;
        i3[1] = CONCAT44(uStack_2b4 >> 0x10,local_2b8 >> 0x10);
        i2[0]._0_4_ = uStack_2b0 >> 0x10;
        i2[0]._4_4_ = uStack_2ac >> 0x10;
        uStack_898 = CONCAT44(uStack_1f4 >> 0xc,local_1f8 >> 0xc);
        temp_3[0] = CONCAT44(uStack_1ec >> 0xc,uStack_1f0 >> 0xc);
        auVar12._8_8_ = temp3.m128i_i128[0];
        auVar12._0_8_ = temp[1];
        auVar11._8_8_ = temp_3[0] & 0xff000000ffU | 0x200000002000000;
        auVar11._0_8_ = uStack_898 & 0xff000000ff | 0x200000002000000;
        auVar26 = pmaddwd(auVar12,auVar11);
        local_2f8 = auVar26._0_4_;
        uStack_2f4 = auVar26._4_4_;
        uStack_2f0 = auVar26._8_4_;
        uStack_2ec = auVar26._12_4_;
        tmp0[3] = (float)(uStack_2f4 >> 0x10);
        tmp0[2] = (float)(local_2f8 >> 0x10);
        i3[0]._0_4_ = uStack_2f0 >> 0x10;
        i3[0]._4_4_ = uStack_2ec >> 0x10;
        auVar22._8_8_ = i0[0];
        auVar22._0_8_ = i1[1];
        auVar21._8_8_ = i1[0];
        auVar21._0_8_ = i2[1];
        auVar26 = packssdw(auVar22,auVar21);
        auVar20._8_8_ = i2[0];
        auVar20._0_8_ = i3[1];
        auVar19._8_8_ = i3[0];
        auVar19._0_4_ = local_2f8 >> 0x10;
        auVar19._4_4_ = uStack_2f4 >> 0x10;
        auVar27 = packssdw(auVar20,auVar19);
        local_6d8 = auVar26._0_2_;
        sStack_6d6 = auVar26._2_2_;
        sStack_6d4 = auVar26._4_2_;
        sStack_6d2 = auVar26._6_2_;
        local_6e8 = auVar27._0_2_;
        sStack_6e6 = auVar27._2_2_;
        sStack_6e4 = auVar27._4_2_;
        sStack_6e2 = auVar27._6_2_;
        sStack_590 = auVar26._8_2_;
        sStack_58e = auVar26._10_2_;
        sStack_58c = auVar26._12_2_;
        sStack_58a = auVar26._14_2_;
        sStack_5a0 = auVar27._8_2_;
        sStack_59e = auVar27._10_2_;
        sStack_59c = auVar27._12_2_;
        sStack_59a = auVar27._14_2_;
        i1[1] = CONCAT17((0 < sStack_59e) * (sStack_59e < 0x100) * auVar27[10] - (0xff < sStack_59e)
                         ,CONCAT16((0 < sStack_6e6) * (sStack_6e6 < 0x100) * auVar27[2] -
                                   (0xff < sStack_6e6),
                                   CONCAT15((0 < sStack_58e) * (sStack_58e < 0x100) * auVar26[10] -
                                            (0xff < sStack_58e),
                                            CONCAT14((0 < sStack_6d6) * (sStack_6d6 < 0x100) *
                                                     auVar26[2] - (0xff < sStack_6d6),
                                                     CONCAT13((0 < sStack_5a0) *
                                                              (sStack_5a0 < 0x100) * auVar27[8] -
                                                              (0xff < sStack_5a0),
                                                              CONCAT12((0 < local_6e8) *
                                                                       (local_6e8 < 0x100) *
                                                                       auVar27[0] -
                                                                       (0xff < local_6e8),
                                                                       CONCAT11((0 < sStack_590) *
                                                                                (sStack_590 < 0x100)
                                                                                * auVar26[8] -
                                                                                (0xff < sStack_590),
                                                                                (0 < local_6d8) *
                                                                                (local_6d8 < 0x100)
                                                                                * auVar26[0] -
                                                                                (0xff < local_6d8)))
                                                             )))));
        i0[0]._0_1_ = (0 < sStack_6d4) * (sStack_6d4 < 0x100) * auVar26[4] - (0xff < sStack_6d4);
        i0[0]._1_1_ = (0 < sStack_58c) * (sStack_58c < 0x100) * auVar26[0xc] - (0xff < sStack_58c);
        i0[0]._2_1_ = (0 < sStack_6e4) * (sStack_6e4 < 0x100) * auVar27[4] - (0xff < sStack_6e4);
        i0[0]._3_1_ = (0 < sStack_59c) * (sStack_59c < 0x100) * auVar27[0xc] - (0xff < sStack_59c);
        i0[0]._4_1_ = (0 < sStack_6d2) * (sStack_6d2 < 0x100) * auVar26[6] - (0xff < sStack_6d2);
        i0[0]._5_1_ = (0 < sStack_58a) * (sStack_58a < 0x100) * auVar26[0xe] - (0xff < sStack_58a);
        i0[0]._6_1_ = (0 < sStack_6e2) * (sStack_6e2 < 0x100) * auVar27[6] - (0xff < sStack_6e2);
        i0[0]._7_1_ = (0 < sStack_59a) * (sStack_59a < 0x100) * auVar27[0xe] - (0xff < sStack_59a);
        *(longlong *)end_output = i1[1];
        *(longlong *)(end_output + 8) = i0[0];
        output = output + 0x40;
        end_output = end_output + 0x10;
      } while (end_output <= puVar24 + -0x10);
      bVar25 = end_output != puVar24;
      end_output = puVar24 + -0x10;
      output = (uchar *)(encode + (long)width_times_channels + -0x10);
    } while (bVar25);
  }
  return;
}

Assistant:

static void STBIR__CODER_NAME( stbir__encode_uint8_srgb )( void * outputp, int width_times_channels, float const * encode )
{
  unsigned char STBIR_SIMD_STREAMOUT_PTR( * ) output = (unsigned char*) outputp;
  unsigned char * end_output = ( (unsigned char*) output ) + width_times_channels;

  #ifdef STBIR_SIMD

  if ( width_times_channels >= 16 )
  {
    float const * end_encode_m16 = encode + width_times_channels - 16;
    end_output -= 16;
    STBIR_SIMD_NO_UNROLL_LOOP_START_INF_FOR
    for(;;)
    {
      stbir__simdf f0, f1, f2, f3;
      stbir__simdi i0, i1, i2, i3;
      STBIR_SIMD_NO_UNROLL(encode);

      stbir__simdf_load4_transposed( f0, f1, f2, f3, encode );

      stbir__min_max_shift20( i0, f0 );
      stbir__min_max_shift20( i1, f1 );
      stbir__min_max_shift20( i2, f2 );
      stbir__min_max_shift20( i3, f3 );

      stbir__simdi_table_lookup4( i0, i1, i2, i3, ( fp32_to_srgb8_tab4 - (127-13)*8 ) );

      stbir__linear_to_srgb_finish( i0, f0 );
      stbir__linear_to_srgb_finish( i1, f1 );
      stbir__linear_to_srgb_finish( i2, f2 );
      stbir__linear_to_srgb_finish( i3, f3 );

      stbir__interleave_pack_and_store_16_u8( output,  STBIR_strs_join1(i, ,stbir__encode_order0), STBIR_strs_join1(i, ,stbir__encode_order1), STBIR_strs_join1(i, ,stbir__encode_order2), STBIR_strs_join1(i, ,stbir__encode_order3) );

      encode += 16;
      output += 16;
      if ( output <= end_output )
        continue;
      if ( output == ( end_output + 16 ) )
        break;
      output = end_output; // backup and do last couple
      encode = end_encode_m16;
    }
    return;
  }
  #endif

  // try to do blocks of 4 when you can
  #if stbir__coder_min_num != 3 // doesn't divide cleanly by four
  output += 4;
  STBIR_SIMD_NO_UNROLL_LOOP_START
  while ( output <= end_output )
  {
    STBIR_SIMD_NO_UNROLL(encode);

    output[0-4] = stbir__linear_to_srgb_uchar( encode[stbir__encode_order0] );
    output[1-4] = stbir__linear_to_srgb_uchar( encode[stbir__encode_order1] );
    output[2-4] = stbir__linear_to_srgb_uchar( encode[stbir__encode_order2] );
    output[3-4] = stbir__linear_to_srgb_uchar( encode[stbir__encode_order3] );

    output += 4;
    encode += 4;
  }
  output -= 4;
  #endif

  // do the remnants
  #if stbir__coder_min_num < 4
  STBIR_NO_UNROLL_LOOP_START
  while( output < end_output )
  {
    STBIR_NO_UNROLL(encode);
    output[0] = stbir__linear_to_srgb_uchar( encode[stbir__encode_order0] );
    #if stbir__coder_min_num >= 2
    output[1] = stbir__linear_to_srgb_uchar( encode[stbir__encode_order1] );
    #endif
    #if stbir__coder_min_num >= 3
    output[2] = stbir__linear_to_srgb_uchar( encode[stbir__encode_order2] );
    #endif
    output += stbir__coder_min_num;
    encode += stbir__coder_min_num;
  }
  #endif
}